

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

Array2D<double> * __thiscall
pbrt::Array2D<double>::operator=(Array2D<double> *this,Array2D<double> *other)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  memory_resource *pmVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  Tuple2<pbrt::Point2,_int> TVar7;
  bool bVar8;
  int iVar9;
  undefined4 extraout_var;
  uint uVar10;
  ulong uVar11;
  Bounds2<int> tmp;
  
  if ((this->allocator).memoryResource == (other->allocator).memoryResource) {
    TVar5 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    TVar6 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    TVar7 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
         (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar7;
    (other->extent).pMin.super_Tuple2<pbrt::Point2,_int> = TVar5;
    (other->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar6;
    pdVar2 = this->values;
    this->values = other->values;
    other->values = pdVar2;
  }
  else {
    bVar8 = Bounds2<int>::operator==(&this->extent,&other->extent);
    iVar9 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar1 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x;
    pdVar2 = this->values;
    if (bVar8) {
      pdVar3 = other->values;
      uVar10 = ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y -
               (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y) * (iVar1 - iVar9);
      for (uVar11 = 0; (~((int)uVar10 >> 0x1f) & uVar10) != uVar11; uVar11 = uVar11 + 1) {
        pdVar2[uVar11] = pdVar3[uVar11];
      }
      TVar5 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
      (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
           (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
      (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar5;
    }
    else {
      pmVar4 = (this->allocator).memoryResource;
      (*pmVar4->_vptr_memory_resource[3])
                (pmVar4,pdVar2,
                 (long)((iVar1 - iVar9) *
                       ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y -
                       (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y)) << 3,8);
      pmVar4 = (this->allocator).memoryResource;
      uVar10 = ((other->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y -
               (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y) *
               ((other->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x -
               (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x);
      iVar9 = (*pmVar4->_vptr_memory_resource[2])(pmVar4,(long)(int)uVar10 * 8,8);
      this->values = (double *)CONCAT44(extraout_var,iVar9);
      pdVar2 = other->values;
      for (uVar11 = 0; (~((int)uVar10 >> 0x1f) & uVar10) != uVar11; uVar11 = uVar11 + 1) {
        ((double *)CONCAT44(extraout_var,iVar9))[uVar11] = pdVar2[uVar11];
      }
    }
  }
  return this;
}

Assistant:

Array2D &operator=(Array2D &&other) {
        if (allocator == other.allocator) {
            pstd::swap(extent, other.extent);
            pstd::swap(values, other.values);
        } else if (extent == other.extent) {
            int n = extent.Area();
            for (int i = 0; i < n; ++i) {
                allocator.destroy(values + i);
                allocator.construct(values + i, other.values[i]);
            }
            extent = other.extent;
        } else {
            int n = extent.Area();
            for (int i = 0; i < n; ++i)
                allocator.destroy(values + i);
            allocator.deallocate_object(values, n);

            int no = other.extent.Area();
            values = allocator.allocate_object<T>(no);
            for (int i = 0; i < no; ++i)
                allocator.construct(values + i, other.values[i]);
        }
        return *this;
    }